

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZAnalysis.cpp
# Opt level: O2

void * TPZAnalysis::ThreadData::ThreadWork(void *datavoid)

{
  long lVar1;
  long lVar2;
  TPZCompEl *pTVar3;
  int64_t iVar4;
  TPZCompEl **ppTVar5;
  ulong uVar6;
  int iVar7;
  ulong uVar8;
  scoped_lock<std::mutex> lock;
  long lVar9;
  undefined8 local_a8;
  TPZManVector<double,_10> errors;
  
  lVar1 = *(long *)((long)datavoid + 8);
  TPZManVector<double,_10>::TPZManVector(&errors,10);
  std::mutex::lock((mutex *)&((pthread_mutex_t *)((long)datavoid + 0x2d08))->__data);
  iVar7 = *(int *)((long)datavoid + 0x120);
  *(int *)((long)datavoid + 0x120) = iVar7 + 1;
  pthread_mutex_unlock((pthread_mutex_t *)((long)datavoid + 0x2d08));
  lVar9 = (long)iVar7 * 0x70;
  do {
    std::mutex::lock((mutex *)&((pthread_mutex_t *)((long)datavoid + 0x2d30))->__data);
    lVar2 = *(long *)((long)datavoid + 0x118);
    *(long *)((long)datavoid + 0x118) = lVar2 + 1;
    pthread_mutex_unlock((pthread_mutex_t *)((long)datavoid + 0x2d30));
    if (lVar2 < lVar1) {
      ppTVar5 = TPZChunkVector<TPZCompEl_*,_10>::operator[]
                          ((TPZChunkVector<TPZCompEl_*,_10> *)datavoid,lVar2);
      pTVar3 = *ppTVar5;
      if (pTVar3 != (TPZCompEl *)0x0) {
        (**(code **)(*(long *)pTVar3 + 0x138))
                  (pTVar3,&errors,*(undefined1 *)((long)datavoid + 0x124));
        iVar4 = errors.super_TPZVec<double>.fNElements;
        local_a8 = 0;
        iVar7 = (int)errors.super_TPZVec<double>.fNElements;
        (**(code **)(*(long *)(*(long *)((long)datavoid + 0x130) + lVar9) + 0x10))
                  (*(long *)((long)datavoid + 0x130) + lVar9,(long)iVar7,&local_a8);
        uVar8 = iVar4 & 0xffffffff;
        if (iVar7 < 1) {
          uVar8 = 0;
        }
        for (uVar6 = 0; uVar8 != uVar6; uVar6 = uVar6 + 1) {
          lVar2 = *(long *)(*(long *)((long)datavoid + 0x130) + 8 + lVar9);
          *(double *)(lVar2 + uVar6 * 8) =
               errors.super_TPZVec<double>.fStore[uVar6] * errors.super_TPZVec<double>.fStore[uVar6]
               + *(double *)(lVar2 + uVar6 * 8);
        }
      }
    }
  } while (*(long *)((long)datavoid + 0x118) < lVar1);
  TPZManVector<double,_10>::~TPZManVector(&errors);
  return datavoid;
}

Assistant:

void *TPZAnalysis::ThreadData::ThreadWork(void *datavoid)
{
  ThreadData *data = (ThreadData *) datavoid;
  const int64_t nelem = data->fElvec.NElements();
  TPZManVector<REAL,10> errors(10);
 
  // Getting unique id for each thread
  const int64_t myid = [&]()
  {
    std::scoped_lock lock(data->fMutexThreadId);
    const int64_t myid_loc = data->ftid;
    data->ftid++;
    return myid_loc;
  }();

  
  
  do{

    const int64_t iel = [&]()
    {
      std::scoped_lock lock(data->fMutexAccessEl);
      const int64_t iel_loc = data->fNextElement;
      data->fNextElement++;
      return iel_loc;
    }();
    
    // For all the elements it tries to get after the last one
    if ( iel >= nelem ) continue;
    
    TPZCompEl *cel = data->fElvec[iel];

    if(!cel) continue;
    
    cel->EvaluateError(errors, data->fStoreError);
    
    const int nerrors = errors.NElements();
    data->fvalues[myid].Resize(nerrors, 0.);


    for(int ier = 0; ier < nerrors; ier++)
    {
      (data->fvalues[myid])[ier] += errors[ier] * errors[ier];
    }
    
    
  } while (data->fNextElement < nelem);
  return data;
}